

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::SetPropertyValueInfo
          (PathTypeHandlerBase *this,PropertyValueInfo *info,RecyclableObject *instance,
          PropertyIndex index,ObjectSlotAttributes attributes)

{
  TypePath *this_00;
  bool bVar1;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = instance;
    info->m_propertyIndex = index;
    info->m_attributes = attributes & ObjectSlotAttr_PropertyAttributesMask;
    info->flags = InlineCacheNoFlags;
  }
  if (DAT_0145c381 == '\x01') {
    this_00 = (this->typePath).ptr;
    if (index < ((this_00->data).ptr)->maxInitializedLength) {
      bVar1 = TypePath::GetIsFixedFieldAt
                        (this_00,index,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      if (info == (PropertyValueInfo *)0x0) {
        return;
      }
      if (!bVar1) {
        return;
      }
    }
    else if (info == (PropertyValueInfo *)0x0) {
      return;
    }
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, PropertyIndex index, ObjectSlotAttributes attributes)
    {
        PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attributes));
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (FixPropsOnPathTypes() && (index >= this->GetTypePath()->GetMaxInitializedLength() || this->GetTypePath()->GetIsFixedFieldAt(index, GetPathLength())))
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
#endif
    }